

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeLT_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeLT_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *in_R9;
  AssertionHelper local_4e0;
  Fixed local_4b0;
  int local_328;
  char local_324 [4];
  undefined1 local_320 [8];
  AssertionResult iutest_ar_1;
  string local_2f0;
  AssertionHelper local_2d0;
  Fixed local_2a0;
  bool local_115 [13];
  unsigned_long local_108 [2];
  ExpressionDecomposer local_f1;
  ExpressionLHS<unsigned_long> local_f0;
  ExpressionResult local_c8;
  ExpressionResult local_a0;
  AssertionResult local_78;
  undefined1 local_50 [8];
  AssertionResult iutest_ar;
  wchar_t negative_sample [5];
  wchar_t negative;
  iu_UnitStringTest_x_iutest_x_OwnWcsicmpNegativeLT_Test *this_local;
  
  iutest_ar.m_result = true;
  iutest_ar._33_7_ = 0x61000000;
  iutest::detail::AlwaysZero();
  local_108[1] = 4;
  iutest::detail::ExpressionDecomposer::operator->*(&local_f0,&local_f1,local_108 + 1);
  local_108[0] = 4;
  iutest::detail::ExpressionLHS<unsigned_long>::operator>=(&local_c8,&local_f0,local_108);
  local_115[0] = true;
  iutest::detail::ExpressionResult::operator&&(&local_a0,&local_c8,local_115);
  iutest::detail::ExpressionResult::GetResult(&local_78,&local_a0,true);
  iutest::AssertionResult::Is((AssertionResult *)local_50,&local_78);
  iutest::AssertionResult::~AssertionResult(&local_78);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_a0);
  iutest::detail::ExpressionResult::~ExpressionResult(&local_c8);
  iutest::detail::ExpressionLHS<unsigned_long>::~ExpressionLHS(&local_f0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    memset(&local_2a0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_2a0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)local_50,
               (AssertionResult *)
               "IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value)))"
               ,"false","true",(char *)in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_2d0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x5a,pcVar2,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_2d0,&local_2a0);
    iutest::AssertionHelper::~AssertionHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    iutest::AssertionHelper::Fixed::~Fixed(&local_2a0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_324[0] = '\0';
    local_324[1] = '\0';
    local_324[2] = '\0';
    local_324[3] = '\0';
    local_328 = iutest::detail::wrapper::iu_wcsicmp(L"AAA",(wchar_t *)&iutest_ar.m_result);
    iutest::internal::CmpHelperLT<int,int>
              ((AssertionResult *)local_320,(internal *)0x1c9d22,
               "::iutest::detail::wrapper::iu_wcsicmp(L\"AAA\", negative_sample)",local_324,
               &local_328,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
    if (!bVar1) {
      memset(&local_4b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_4b0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_320);
      iutest::AssertionHelper::AssertionHelper
                (&local_4e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
                 ,0x5b,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_4e0,&local_4b0);
      iutest::AssertionHelper::~AssertionHelper(&local_4e0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_4b0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  }
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnWcsicmpNegativeLT)
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME(sizeof(::std::wint_t) >= sizeof(int) && (sizeof(wchar_t) > 2 || ::iutest_type_traits::is_signed<wchar_t>::value));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_wcsicmp(L"AAA", negative_sample));
}